

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O1

void WriteDump(aiScene *scene,FILE *out,char *src,char *cmd,bool shortened)

{
  byte bVar1;
  aiTexture *paVar2;
  aiTexel *paVar3;
  aiMaterial *paVar4;
  aiMaterialProperty *paVar5;
  aiAnimation *in;
  aiNodeAnim *in_00;
  aiVectorKey *paVar6;
  aiQuatKey *paVar7;
  aiMesh *paVar8;
  aiBone *in_01;
  aiFace *paVar9;
  aiVector3D *paVar10;
  aiColor4D *paVar11;
  _Alloc_hider _Var12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  tm *__tp;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  size_t sVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  uint a;
  ulong uVar24;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  long *local_4b8;
  long local_4b0;
  long local_4a8 [2];
  string c;
  time_t tt;
  tm now;
  aiString name;
  
  tt = time((time_t *)0x0);
  __tp = gmtime_r(&tt,(tm *)&now);
  if (__tp == (tm *)0x0) {
    __assert_fail("nullptr != p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/tools/assimp_cmd/WriteDumb.cpp"
                  ,0x36f,"void WriteDump(const aiScene *, FILE *, const char *, const char *, bool)"
                 );
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&c,cmd,(allocator<char> *)&name);
  lVar16 = std::__cxx11::string::find((char *)&c,0x69fb83,0);
  if (lVar16 != -1) {
    do {
      c._M_dataplus._M_p[lVar16] = '?';
      lVar16 = std::__cxx11::string::find((char *)&c,0x69fb83,0);
    } while (lVar16 != -1);
  }
  name.length = 0;
  name.data[0] = '\0';
  memset(name.data + 1,0x1b,0x3ff);
  uVar13 = aiGetVersionMajor();
  uVar14 = aiGetVersionMinor();
  uVar15 = aiGetVersionRevision();
  _Var12 = c._M_dataplus;
  pcVar17 = asctime(__tp);
  fprintf((FILE *)out,
          "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<ASSIMP format_id=\"1\">\n\n<!-- XML Model dump produced by assimp dump\n  Library version: %u.%u.%u\n  Source: %s\n  Command line: %s\n  %s\n--> \n\n<Scene flags=\"%u\" postprocessing=\"%i\">\n"
          ,(ulong)uVar13,(ulong)uVar14,(ulong)uVar15,src,_Var12._M_p,pcVar17,(ulong)scene->mFlags,0)
  ;
  WriteNode(scene->mRootNode,out,0);
  if (scene->mNumTextures != 0) {
    fprintf((FILE *)out,"<TextureList num=\"%u\">\n");
    if (scene->mNumTextures != 0) {
      uVar24 = 0;
      do {
        paVar2 = scene->mTextures[uVar24];
        if (paVar2->mHeight == 0) {
          fprintf((FILE *)out,"\t<Texture width=\"%i\" height=\"%i\" compressed=\"%s\"> \n",
                  0xffffffff,0xffffffff,"true");
          fprintf((FILE *)out,"\t\t<Data length=\"%u\"> \n",(ulong)paVar2->mWidth);
          if ((!shortened) && (paVar2->mWidth != 0)) {
            uVar20 = 0;
            do {
              fprintf((FILE *)out,"\t\t\t%2x",(ulong)(&paVar2->pcData->b)[uVar20]);
              if ((uVar20 != 0) && ((int)((uVar20 & 0xffffffff) / 0x32) * -0x32 + (int)uVar20 == 0))
              {
                fputc(10,(FILE *)out);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < paVar2->mWidth);
          }
        }
        else {
          fprintf((FILE *)out,"\t<Texture width=\"%i\" height=\"%i\" compressed=\"%s\"> \n",
                  (ulong)paVar2->mWidth,(ulong)paVar2->mHeight,"false");
          if ((!shortened) &&
             (fprintf((FILE *)out,"\t\t<Data length=\"%i\"> \n",
                      (ulong)(paVar2->mWidth * paVar2->mHeight * 4)), paVar2->mHeight != 0)) {
            uVar13 = 0;
            do {
              uVar20 = (ulong)paVar2->mWidth;
              if (paVar2->mWidth != 0) {
                uVar23 = 0;
                do {
                  uVar14 = (int)uVar20 * uVar13;
                  paVar3 = paVar2->pcData;
                  fprintf((FILE *)out,"\t\t\t%2x %2x %2x %2x",(ulong)paVar3[uVar14 + uVar23].r,
                          (ulong)paVar3[uVar14 + uVar23].g,(ulong)paVar3[uVar14 + uVar23].b,
                          (ulong)paVar3[uVar14 + uVar23].a);
                  if ((paVar2->mWidth * uVar13 + (int)uVar23 & 3) == 0) {
                    fputc(10,(FILE *)out);
                  }
                  uVar23 = uVar23 + 1;
                  uVar20 = (ulong)paVar2->mWidth;
                } while (uVar23 < uVar20);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < paVar2->mHeight);
          }
        }
        fwrite("\t\t</Data>\n\t</Texture>\n",0x16,1,(FILE *)out);
        uVar24 = uVar24 + 1;
      } while (uVar24 < scene->mNumTextures);
    }
    fwrite("</TextureList>\n",0xf,1,(FILE *)out);
  }
  if (scene->mNumMaterials != 0) {
    fprintf((FILE *)out,"<MaterialList num=\"%u\">\n");
    if (scene->mNumMaterials != 0) {
      uVar24 = 0;
      do {
        paVar4 = scene->mMaterials[uVar24];
        fwrite("\t<Material>\n",0xc,1,(FILE *)out);
        fprintf((FILE *)out,"\t\t<MatPropertyList  num=\"%u\">\n",(ulong)paVar4->mNumProperties);
        if (paVar4->mNumProperties != 0) {
          uVar20 = 0;
          do {
            paVar5 = paVar4->mProperties[uVar20];
            uVar13 = paVar5->mType - aiPTI_Float;
            pcVar17 = "";
            if (uVar13 < 5) {
              pcVar17 = &DAT_00697778 + *(int *)(&DAT_00697778 + (ulong)uVar13 * 4);
            }
            pcVar18 = TextureTypeToString(paVar5->mSemantic);
            fprintf((FILE *)out,
                    "\t\t\t<MatProperty key=\"%s\" \n\t\t\ttype=\"%s\" tex_usage=\"%s\" tex_index=\"%u\""
                    ,(paVar5->mKey).data,pcVar17,pcVar18,(ulong)paVar5->mIndex);
            switch(paVar5->mType) {
            case aiPTI_Float:
              fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)(paVar5->mDataLength >> 2));
              if (3 < paVar5->mDataLength) {
                uVar23 = 0;
                do {
                  fprintf((FILE *)out,"%f ",(double)*(float *)(paVar5->mData + uVar23 * 4));
                  uVar23 = uVar23 + 1;
                } while (uVar23 < paVar5->mDataLength >> 2);
              }
              break;
            case aiPTI_String:
              pcVar18 = paVar5->mData;
              pcVar17 = pcVar18 + 4;
              local_4b8 = local_4a8;
              sVar19 = strlen(pcVar17);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4b8,pcVar17,pcVar18 + sVar19 + 4);
              local_4d8 = &local_4c8;
              local_4d0 = 0;
              local_4c8 = 0;
              std::__cxx11::string::reserve((ulong)&local_4d8);
              if (local_4b0 != 0) {
                lVar16 = 0;
                do {
                  bVar1 = *(byte *)((long)local_4b8 + lVar16);
                  if (bVar1 < 0x27) {
                    if ((bVar1 == 0x22) || (bVar1 == 0x26)) goto LAB_002ee3f0;
LAB_002ee40a:
                    std::__cxx11::string::append((char *)&local_4d8,(long)local_4b8 + lVar16);
                  }
                  else {
                    if ((bVar1 != 0x27) && ((bVar1 != 0x3c && (bVar1 != 0x3e)))) goto LAB_002ee40a;
LAB_002ee3f0:
                    std::__cxx11::string::append((char *)&local_4d8);
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 != local_4b0);
              }
              fprintf((FILE *)out,">\n\t\t\t\t\"%s\"",local_4d8);
              if (local_4d8 != &local_4c8) {
                operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
              }
              if (local_4b8 != local_4a8) {
                operator_delete(local_4b8,local_4a8[0] + 1);
              }
              break;
            case aiPTI_Integer:
              fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)(paVar5->mDataLength >> 2));
              if (3 < paVar5->mDataLength) {
                uVar23 = 0;
                do {
                  fprintf((FILE *)out,"%i ",(ulong)*(uint *)(paVar5->mData + uVar23 * 4));
                  uVar23 = uVar23 + 1;
                } while (uVar23 < paVar5->mDataLength >> 2);
              }
              break;
            case aiPTI_Buffer:
              fprintf((FILE *)out," size=\"%i\">\n\t\t\t\t",(ulong)paVar5->mDataLength);
              if (paVar5->mDataLength != 0) {
                uVar23 = 0;
                do {
                  fprintf((FILE *)out,"%2x ",(ulong)(uint)(int)paVar5->mData[uVar23]);
                  if ((uVar23 != 0) &&
                     ((int)((uVar23 & 0xffffffff) / 0x1e) * -0x1e + (int)uVar23 == 0)) {
                    fwrite("\n\t\t\t\t",5,1,(FILE *)out);
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 < paVar5->mDataLength);
              }
            }
            fwrite("\n\t\t\t</MatProperty>\n",0x13,1,(FILE *)out);
            uVar20 = uVar20 + 1;
          } while (uVar20 < paVar4->mNumProperties);
        }
        fwrite("\t\t</MatPropertyList>\n",0x15,1,(FILE *)out);
        fwrite("\t</Material>\n",0xd,1,(FILE *)out);
        uVar24 = uVar24 + 1;
      } while (uVar24 < scene->mNumMaterials);
    }
    fwrite("</MaterialList>\n",0x10,1,(FILE *)out);
  }
  if (scene->mNumAnimations != 0) {
    fprintf((FILE *)out,"<AnimationList num=\"%u\">\n");
    if (scene->mNumAnimations != 0) {
      uVar24 = 0;
      do {
        in = scene->mAnimations[uVar24];
        ConvertName(&name,&in->mName);
        fprintf((FILE *)out,"\t<Animation name=\"%s\" duration=\"%e\" tick_cnt=\"%e\">\n",
                in->mDuration,in->mTicksPerSecond,name.data);
        if (in->mNumChannels != 0) {
          fprintf((FILE *)out,"\t\t<NodeAnimList num=\"%u\">\n");
          if (in->mNumChannels != 0) {
            uVar20 = 0;
            do {
              in_00 = in->mChannels[uVar20];
              ConvertName(&name,&in_00->mNodeName);
              fprintf((FILE *)out,"\t\t\t<NodeAnim node=\"%s\">\n",name.data);
              if (!shortened) {
                if (in_00->mNumPositionKeys != 0) {
                  fprintf((FILE *)out,"\t\t\t\t<PositionKeyList num=\"%u\">\n");
                  if (in_00->mNumPositionKeys != 0) {
                    lVar16 = 0x10;
                    uVar23 = 0;
                    do {
                      paVar6 = in_00->mPositionKeys;
                      fprintf((FILE *)out,
                              "\t\t\t\t\t<PositionKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</PositionKey>\n"
                              ,*(undefined8 *)((long)paVar6 + lVar16 + -0x10),
                              (double)*(float *)((long)paVar6 + lVar16 + -8),
                              (double)*(float *)((long)paVar6 + lVar16 + -4),
                              (double)*(float *)((long)&paVar6->mTime + lVar16));
                      uVar23 = uVar23 + 1;
                      lVar16 = lVar16 + 0x18;
                    } while (uVar23 < in_00->mNumPositionKeys);
                  }
                  fwrite("\t\t\t\t</PositionKeyList>\n",0x17,1,(FILE *)out);
                }
                if (in_00->mNumScalingKeys != 0) {
                  fprintf((FILE *)out,"\t\t\t\t<ScalingKeyList num=\"%u\">\n");
                  if (in_00->mNumScalingKeys != 0) {
                    lVar16 = 0x10;
                    uVar23 = 0;
                    do {
                      paVar6 = in_00->mScalingKeys;
                      fprintf((FILE *)out,
                              "\t\t\t\t\t<ScalingKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</ScalingKey>\n"
                              ,*(undefined8 *)((long)paVar6 + lVar16 + -0x10),
                              (double)*(float *)((long)paVar6 + lVar16 + -8),
                              (double)*(float *)((long)paVar6 + lVar16 + -4),
                              (double)*(float *)((long)&paVar6->mTime + lVar16));
                      uVar23 = uVar23 + 1;
                      lVar16 = lVar16 + 0x18;
                    } while (uVar23 < in_00->mNumScalingKeys);
                  }
                  fwrite("\t\t\t\t</ScalingKeyList>\n",0x16,1,(FILE *)out);
                }
                if (in_00->mNumRotationKeys != 0) {
                  fprintf((FILE *)out,"\t\t\t\t<RotationKeyList num=\"%u\">\n");
                  if (in_00->mNumRotationKeys != 0) {
                    lVar16 = 0x14;
                    uVar23 = 0;
                    do {
                      paVar7 = in_00->mRotationKeys;
                      fprintf((FILE *)out,
                              "\t\t\t\t\t<RotationKey time=\"%e\">\n\t\t\t\t\t\t%0 8f %0 8f %0 8f %0 8f\n\t\t\t\t\t</RotationKey>\n"
                              ,*(undefined8 *)((long)paVar7 + lVar16 + -0x14),
                              (double)*(float *)((long)paVar7 + lVar16 + -8),
                              (double)*(float *)((long)paVar7 + lVar16 + -4),
                              (double)*(float *)((long)&paVar7->mTime + lVar16),
                              (double)*(float *)((long)paVar7 + lVar16 + -0xc));
                      uVar23 = uVar23 + 1;
                      lVar16 = lVar16 + 0x18;
                    } while (uVar23 < in_00->mNumRotationKeys);
                  }
                  fwrite("\t\t\t\t</RotationKeyList>\n",0x17,1,(FILE *)out);
                }
              }
              fwrite("\t\t\t</NodeAnim>\n",0xf,1,(FILE *)out);
              uVar20 = uVar20 + 1;
            } while (uVar20 < in->mNumChannels);
          }
          fwrite("\t\t</NodeAnimList>\n",0x12,1,(FILE *)out);
        }
        fwrite("\t</Animation>\n",0xe,1,(FILE *)out);
        uVar24 = uVar24 + 1;
      } while (uVar24 < scene->mNumAnimations);
    }
    fwrite("</AnimationList>\n",0x11,1,(FILE *)out);
  }
  if (scene->mNumMeshes != 0) {
    fprintf((FILE *)out,"<MeshList num=\"%u\">\n");
    if (scene->mNumMeshes != 0) {
      uVar24 = 0;
      do {
        paVar8 = scene->mMeshes[uVar24];
        uVar13 = paVar8->mPrimitiveTypes;
        pcVar17 = "points";
        if ((uVar13 & 1) == 0) {
          pcVar17 = "";
        }
        pcVar18 = "lines";
        if ((uVar13 & 2) == 0) {
          pcVar18 = "";
        }
        pcVar21 = "triangles";
        if ((uVar13 & 4) == 0) {
          pcVar21 = "";
        }
        pcVar22 = "polygons";
        if ((uVar13 & 8) == 0) {
          pcVar22 = "";
        }
        fprintf((FILE *)out,"\t<Mesh types=\"%s %s %s %s\" material_index=\"%u\">\n",pcVar17,pcVar18
                ,pcVar21,pcVar22,(ulong)paVar8->mMaterialIndex);
        if (paVar8->mNumBones != 0) {
          fprintf((FILE *)out,"\t\t<BoneList num=\"%u\">\n");
          if (paVar8->mNumBones != 0) {
            uVar20 = 0;
            do {
              in_01 = paVar8->mBones[uVar20];
              ConvertName(&name,&in_01->mName);
              fprintf((FILE *)out,
                      "\t\t\t<Bone name=\"%s\">\n\t\t\t\t<Matrix4> \n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n\t\t\t\t</Matrix4> \n"
                      ,(double)(in_01->mOffsetMatrix).a1,(double)(in_01->mOffsetMatrix).a2,
                      (double)(in_01->mOffsetMatrix).a3,(double)(in_01->mOffsetMatrix).a4,
                      (double)(in_01->mOffsetMatrix).b1,(double)(in_01->mOffsetMatrix).b2,
                      (double)(in_01->mOffsetMatrix).b3,(double)(in_01->mOffsetMatrix).b4,name.data)
              ;
              if ((!shortened) && (in_01->mNumWeights != 0)) {
                fprintf((FILE *)out,"\t\t\t\t<WeightList num=\"%u\">\n");
                if (in_01->mNumWeights != 0) {
                  uVar23 = 0;
                  do {
                    fprintf((FILE *)out,
                            "\t\t\t\t\t<Weight index=\"%u\">\n\t\t\t\t\t\t%f\n\t\t\t\t\t</Weight>\n"
                            ,(double)in_01->mWeights[uVar23].mWeight,
                            (ulong)in_01->mWeights[uVar23].mVertexId);
                    uVar23 = uVar23 + 1;
                  } while (uVar23 < in_01->mNumWeights);
                }
                fwrite("\t\t\t\t</WeightList>\n",0x12,1,(FILE *)out);
              }
              fwrite("\t\t\t</Bone>\n",0xb,1,(FILE *)out);
              uVar20 = uVar20 + 1;
            } while (uVar20 < paVar8->mNumBones);
          }
          fwrite("\t\t</BoneList>\n",0xe,1,(FILE *)out);
        }
        if ((!shortened) && (paVar8->mNumFaces != 0)) {
          fprintf((FILE *)out,"\t\t<FaceList num=\"%u\">\n");
          if (paVar8->mNumFaces != 0) {
            uVar20 = 0;
            do {
              paVar9 = paVar8->mFaces;
              fprintf((FILE *)out,"\t\t\t<Face num=\"%u\">\n\t\t\t\t",
                      (ulong)paVar9[uVar20].mNumIndices);
              if (paVar9[uVar20].mNumIndices != 0) {
                uVar23 = 0;
                do {
                  fprintf((FILE *)out,"%u ",(ulong)paVar9[uVar20].mIndices[uVar23]);
                  uVar23 = uVar23 + 1;
                } while (uVar23 < paVar9[uVar20].mNumIndices);
              }
              fwrite("\n\t\t\t</Face>\n",0xc,1,(FILE *)out);
              uVar20 = uVar20 + 1;
            } while (uVar20 < paVar8->mNumFaces);
          }
          fwrite("\t\t</FaceList>\n",0xe,1,(FILE *)out);
        }
        if (paVar8->mNumVertices != 0 && paVar8->mVertices != (aiVector3D *)0x0) {
          fprintf((FILE *)out,"\t\t<Positions num=\"%u\" set=\"0\" num_components=\"3\"> \n");
          if ((!shortened) && (paVar8->mNumVertices != 0)) {
            lVar16 = 8;
            uVar20 = 0;
            do {
              paVar10 = paVar8->mVertices;
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                      (double)*(float *)((long)paVar10 + lVar16 + -8),
                      (double)*(float *)((long)paVar10 + lVar16 + -4),
                      (double)*(float *)((long)&paVar10->x + lVar16));
              uVar20 = uVar20 + 1;
              lVar16 = lVar16 + 0xc;
            } while (uVar20 < paVar8->mNumVertices);
          }
          fwrite("\t\t</Positions>\n",0xf,1,(FILE *)out);
        }
        if (paVar8->mNumVertices != 0 && paVar8->mNormals != (aiVector3D *)0x0) {
          fprintf((FILE *)out,"\t\t<Normals num=\"%u\" set=\"0\" num_components=\"3\"> \n");
          if ((!shortened) && (paVar8->mNumVertices != 0)) {
            lVar16 = 8;
            uVar20 = 0;
            do {
              paVar10 = paVar8->mNormals;
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                      (double)*(float *)((long)paVar10 + lVar16 + -8),
                      (double)*(float *)((long)paVar10 + lVar16 + -4),
                      (double)*(float *)((long)&paVar10->x + lVar16));
              uVar20 = uVar20 + 1;
              lVar16 = lVar16 + 0xc;
            } while (uVar20 < paVar8->mNumVertices);
          }
          fwrite("\t\t</Normals>\n",0xd,1,(FILE *)out);
        }
        if (((paVar8->mTangents != (aiVector3D *)0x0) && (paVar8->mBitangents != (aiVector3D *)0x0))
           && (paVar8->mNumVertices != 0)) {
          fprintf((FILE *)out,"\t\t<Tangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                  (ulong)paVar8->mNumVertices);
          if (shortened) {
            fwrite("\t\t</Tangents>\n",0xe,1,(FILE *)out);
            fprintf((FILE *)out,"\t\t<Bitangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                    (ulong)paVar8->mNumVertices);
          }
          else {
            if (paVar8->mNumVertices != 0) {
              lVar16 = 8;
              uVar20 = 0;
              do {
                paVar10 = paVar8->mTangents;
                fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                        (double)*(float *)((long)paVar10 + lVar16 + -8),
                        (double)*(float *)((long)paVar10 + lVar16 + -4),
                        (double)*(float *)((long)&paVar10->x + lVar16));
                uVar20 = uVar20 + 1;
                lVar16 = lVar16 + 0xc;
              } while (uVar20 < paVar8->mNumVertices);
            }
            fwrite("\t\t</Tangents>\n",0xe,1,(FILE *)out);
            fprintf((FILE *)out,"\t\t<Bitangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",
                    (ulong)paVar8->mNumVertices);
            if ((!shortened) && (paVar8->mNumVertices != 0)) {
              lVar16 = 8;
              uVar20 = 0;
              do {
                paVar10 = paVar8->mBitangents;
                fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                        (double)*(float *)((long)paVar10 + lVar16 + -8),
                        (double)*(float *)((long)paVar10 + lVar16 + -4),
                        (double)*(float *)((long)&paVar10->x + lVar16));
                uVar20 = uVar20 + 1;
                lVar16 = lVar16 + 0xc;
              } while (uVar20 < paVar8->mNumVertices);
            }
          }
          fwrite("\t\t</Bitangents>\n",0x10,1,(FILE *)out);
        }
        uVar20 = 0;
        do {
          if (paVar8->mTextureCoords[uVar20] == (aiVector3D *)0x0) break;
          fprintf((FILE *)out,"\t\t<TextureCoords num=\"%u\" set=\"%u\" num_components=\"%u\"> \n",
                  (ulong)paVar8->mNumVertices,uVar20 & 0xffffffff,
                  (ulong)paVar8->mNumUVComponents[uVar20]);
          if (!shortened) {
            if (paVar8->mNumUVComponents[uVar20] == 3) {
              if (paVar8->mNumVertices != 0) {
                lVar16 = 8;
                uVar23 = 0;
                do {
                  paVar10 = paVar8->mTextureCoords[uVar20];
                  fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f\n",
                          (double)*(float *)((long)paVar10 + lVar16 + -8),
                          (double)*(float *)((long)paVar10 + lVar16 + -4),
                          (double)*(float *)((long)&paVar10->x + lVar16));
                  uVar23 = uVar23 + 1;
                  lVar16 = lVar16 + 0xc;
                } while (uVar23 < paVar8->mNumVertices);
              }
            }
            else if (paVar8->mNumVertices != 0) {
              lVar16 = 4;
              uVar23 = 0;
              do {
                fprintf((FILE *)out,"\t\t%0 8f %0 8f\n",
                        (double)*(float *)((long)paVar8->mTextureCoords[uVar20] + lVar16 + -4),
                        (double)*(float *)((long)&paVar8->mTextureCoords[uVar20]->x + lVar16));
                uVar23 = uVar23 + 1;
                lVar16 = lVar16 + 0xc;
              } while (uVar23 < paVar8->mNumVertices);
            }
          }
          fwrite("\t\t</TextureCoords>\n",0x13,1,(FILE *)out);
          uVar20 = uVar20 + 1;
        } while (uVar20 != 8);
        uVar20 = 0;
        do {
          if (paVar8->mColors[uVar20] == (aiColor4D *)0x0) break;
          fprintf((FILE *)out,"\t\t<Colors num=\"%u\" set=\"%u\" num_components=\"4\"> \n",
                  (ulong)paVar8->mNumVertices,uVar20 & 0xffffffff);
          if ((!shortened) && (paVar8->mNumVertices != 0)) {
            lVar16 = 0xc;
            uVar23 = 0;
            do {
              paVar11 = paVar8->mColors[uVar20];
              fprintf((FILE *)out,"\t\t%0 8f %0 8f %0 8f %0 8f\n",
                      (double)*(float *)((long)paVar11 + lVar16 + -0xc),
                      (double)*(float *)((long)paVar11 + lVar16 + -8),
                      (double)*(float *)((long)paVar11 + lVar16 + -4),
                      (double)*(float *)((long)&paVar11->r + lVar16));
              uVar23 = uVar23 + 1;
              lVar16 = lVar16 + 0x10;
            } while (uVar23 < paVar8->mNumVertices);
          }
          fwrite("\t\t</Colors>\n",0xc,1,(FILE *)out);
          uVar20 = uVar20 + 1;
        } while (uVar20 != 8);
        fwrite("\t</Mesh>\n",9,1,(FILE *)out);
        uVar24 = uVar24 + 1;
      } while (uVar24 < scene->mNumMeshes);
    }
    fwrite("</MeshList>\n",0xc,1,(FILE *)out);
  }
  fwrite("</Scene>\n</ASSIMP>",0x12,1,(FILE *)out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)c._M_dataplus._M_p != &c.field_2) {
    operator_delete(c._M_dataplus._M_p,c.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WriteDump(const aiScene* scene, FILE* out, const char* src, const char* cmd, bool shortened)
{
	time_t tt = ::time(NULL);
#if _WIN32
    tm* p = gmtime(&tt);
#else
    struct tm now;
    tm* p = gmtime_r(&tt, &now);
#endif
    ai_assert(nullptr != p);

	std::string c = cmd;
	std::string::size_type s; 

	// https://sourceforge.net/tracker/?func=detail&aid=3167364&group_id=226462&atid=1067632
	// -- not allowed in XML comments
	while((s = c.find("--")) != std::string::npos) {
		c[s] = '?';
	}
	aiString name;

	// write header
	fprintf(out,
		"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
		"<ASSIMP format_id=\"1\">\n\n"

		"<!-- XML Model dump produced by assimp dump\n"
		"  Library version: %u.%u.%u\n"
		"  Source: %s\n"
		"  Command line: %s\n"
		"  %s\n"
		"-->"
		" \n\n"
		"<Scene flags=\"%u\" postprocessing=\"%i\">\n",
		
		aiGetVersionMajor(),aiGetVersionMinor(),aiGetVersionRevision(),src,c.c_str(),asctime(p),
		scene->mFlags,
		0 /*globalImporter->GetEffectivePostProcessing()*/);

	// write the node graph
	WriteNode(scene->mRootNode, out, 0);

#if 0
		// write cameras
	for (unsigned int i = 0; i < scene->mNumCameras;++i) {
		aiCamera* cam  = scene->mCameras[i];
		ConvertName(name,cam->mName);

		// camera header
		fprintf(out,"\t<Camera parent=\"%s\">\n"
			"\t\t<Vector3 name=\"up\"        > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"lookat\"    > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"pos\"       > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Float   name=\"fov\"       > %f </Float>\n"
			"\t\t<Float   name=\"aspect\"    > %f </Float>\n"
			"\t\t<Float   name=\"near_clip\" > %f </Float>\n"
			"\t\t<Float   name=\"far_clip\"  > %f </Float>\n"
			"\t</Camera>\n",
			name.data,
			cam->mUp.x,cam->mUp.y,cam->mUp.z,
			cam->mLookAt.x,cam->mLookAt.y,cam->mLookAt.z,
			cam->mPosition.x,cam->mPosition.y,cam->mPosition.z,
			cam->mHorizontalFOV,cam->mAspect,cam->mClipPlaneNear,cam->mClipPlaneFar,i);
	}

	// write lights
	for (unsigned int i = 0; i < scene->mNumLights;++i) {
		aiLight* l  = scene->mLights[i];
		ConvertName(name,l->mName);

		// light header
		fprintf(out,"\t<Light parent=\"%s\"> type=\"%s\"\n"
			"\t\t<Vector3 name=\"diffuse\"   > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"specular\"  > %0 8f %0 8f %0 8f </Vector3>\n"
			"\t\t<Vector3 name=\"ambient\"   > %0 8f %0 8f %0 8f </Vector3>\n",
			name.data,
			(l->mType == aiLightSource_DIRECTIONAL ? "directional" :
			(l->mType == aiLightSource_POINT ? "point" : "spot" )),
			l->mColorDiffuse.r, l->mColorDiffuse.g, l->mColorDiffuse.b,
			l->mColorSpecular.r,l->mColorSpecular.g,l->mColorSpecular.b,
			l->mColorAmbient.r, l->mColorAmbient.g, l->mColorAmbient.b);

		if (l->mType != aiLightSource_DIRECTIONAL) {
			fprintf(out,
				"\t\t<Vector3 name=\"pos\"       > %0 8f %0 8f %0 8f </Vector3>\n"
				"\t\t<Float   name=\"atten_cst\" > %f </Float>\n"
				"\t\t<Float   name=\"atten_lin\" > %f </Float>\n"
				"\t\t<Float   name=\"atten_sqr\" > %f </Float>\n",
				l->mPosition.x,l->mPosition.y,l->mPosition.z,
				l->mAttenuationConstant,l->mAttenuationLinear,l->mAttenuationQuadratic);
		}

		if (l->mType != aiLightSource_POINT) {
			fprintf(out,
				"\t\t<Vector3 name=\"lookat\"    > %0 8f %0 8f %0 8f </Vector3>\n",
				l->mDirection.x,l->mDirection.y,l->mDirection.z);
		}

		if (l->mType == aiLightSource_SPOT) {
			fprintf(out,
				"\t\t<Float   name=\"cone_out\" > %f </Float>\n"
				"\t\t<Float   name=\"cone_inn\" > %f </Float>\n",
				l->mAngleOuterCone,l->mAngleInnerCone);
		}
		fprintf(out,"\t</Light>\n");
	}
#endif

	// write textures
	if (scene->mNumTextures) {
		fprintf(out,"<TextureList num=\"%u\">\n",scene->mNumTextures);
		for (unsigned int i = 0; i < scene->mNumTextures;++i) {
			aiTexture* tex  = scene->mTextures[i];
			bool compressed = (tex->mHeight == 0);

			// mesh header
			fprintf(out,"\t<Texture width=\"%i\" height=\"%i\" compressed=\"%s\"> \n",
				(compressed ? -1 : tex->mWidth),(compressed ? -1 : tex->mHeight),
				(compressed ? "true" : "false"));

			if (compressed) {
				fprintf(out,"\t\t<Data length=\"%u\"> \n",tex->mWidth);

				if (!shortened) {
					for (unsigned int n = 0; n < tex->mWidth;++n) {
						fprintf(out,"\t\t\t%2x",reinterpret_cast<uint8_t*>(tex->pcData)[n]);
						if (n && !(n % 50)) {
							fprintf(out,"\n");
						}
					}
				}
			}
			else if (!shortened){
				fprintf(out,"\t\t<Data length=\"%i\"> \n",tex->mWidth*tex->mHeight*4);

				// const unsigned int width = (unsigned int)log10((double)std::max(tex->mHeight,tex->mWidth))+1;
				for (unsigned int y = 0; y < tex->mHeight;++y) {
					for (unsigned int x = 0; x < tex->mWidth;++x) {
						aiTexel* tx = tex->pcData + y*tex->mWidth+x;
						unsigned int r = tx->r,g=tx->g,b=tx->b,a=tx->a;
						fprintf(out,"\t\t\t%2x %2x %2x %2x",r,g,b,a);

						// group by four for readibility
						if (0 == (x+y*tex->mWidth) % 4)
							fprintf(out,"\n");
					}
				}
			}
			fprintf(out,"\t\t</Data>\n\t</Texture>\n");
		}
		fprintf(out,"</TextureList>\n");
	}

	// write materials
	if (scene->mNumMaterials) {
		fprintf(out,"<MaterialList num=\"%u\">\n",scene->mNumMaterials);
		for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
			const aiMaterial* mat = scene->mMaterials[i];

			fprintf(out,"\t<Material>\n");
			fprintf(out,"\t\t<MatPropertyList  num=\"%u\">\n",mat->mNumProperties);
			for (unsigned int n = 0; n < mat->mNumProperties;++n) {

				const aiMaterialProperty* prop = mat->mProperties[n];
				const char* sz = "";
				if (prop->mType == aiPTI_Float) {
					sz = "float";
				}
				else if (prop->mType == aiPTI_Integer) {
					sz = "integer";
				}
				else if (prop->mType == aiPTI_String) {
					sz = "string";
				}
				else if (prop->mType == aiPTI_Buffer) {
					sz = "binary_buffer";
				}

				fprintf(out,"\t\t\t<MatProperty key=\"%s\" \n\t\t\ttype=\"%s\" tex_usage=\"%s\" tex_index=\"%u\"",
					prop->mKey.data, sz,
					::TextureTypeToString((aiTextureType)prop->mSemantic),prop->mIndex);

				if (prop->mType == aiPTI_Float) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength/sizeof(float)));

					for (unsigned int p = 0; p < prop->mDataLength/sizeof(float);++p) {
						fprintf(out,"%f ",*((float*)(prop->mData+p*sizeof(float))));
					}
				}
				else if (prop->mType == aiPTI_Integer) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength/sizeof(int)));

					for (unsigned int p = 0; p < prop->mDataLength/sizeof(int);++p) {
						fprintf(out,"%i ",*((int*)(prop->mData+p*sizeof(int))));
					}
				}
				else if (prop->mType == aiPTI_Buffer) {
					fprintf(out," size=\"%i\">\n\t\t\t\t",
						static_cast<int>(prop->mDataLength));

					for (unsigned int p = 0; p < prop->mDataLength;++p) {
						fprintf(out,"%2x ",prop->mData[p]);
						if (p && 0 == p%30) {
							fprintf(out,"\n\t\t\t\t");
						}
					}
				}
				else if (prop->mType == aiPTI_String) {
					fprintf(out,">\n\t\t\t\t\"%s\"",encodeXML(prop->mData+4).c_str() /* skip length */);
				}
				fprintf(out,"\n\t\t\t</MatProperty>\n");
			}
			fprintf(out,"\t\t</MatPropertyList>\n");
			fprintf(out,"\t</Material>\n");
		}
		fprintf(out,"</MaterialList>\n");
	}

	// write animations
	if (scene->mNumAnimations) {
		fprintf(out,"<AnimationList num=\"%u\">\n",scene->mNumAnimations);
		for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
			aiAnimation* anim = scene->mAnimations[i];

			// anim header
			ConvertName(name,anim->mName);
			fprintf(out,"\t<Animation name=\"%s\" duration=\"%e\" tick_cnt=\"%e\">\n",
				name.data, anim->mDuration, anim->mTicksPerSecond);

			// write bone animation channels
			if (anim->mNumChannels) {
				fprintf(out,"\t\t<NodeAnimList num=\"%u\">\n",anim->mNumChannels);
				for (unsigned int n = 0; n < anim->mNumChannels;++n) {
					aiNodeAnim* nd = anim->mChannels[n];

					// node anim header
					ConvertName(name,nd->mNodeName);
					fprintf(out,"\t\t\t<NodeAnim node=\"%s\">\n",name.data);

					if (!shortened) {
						// write position keys
						if (nd->mNumPositionKeys) {
							fprintf(out,"\t\t\t\t<PositionKeyList num=\"%u\">\n",nd->mNumPositionKeys);
							for (unsigned int a = 0; a < nd->mNumPositionKeys;++a) {
								aiVectorKey* vc = nd->mPositionKeys+a;
								fprintf(out,"\t\t\t\t\t<PositionKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</PositionKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z);
							}
							fprintf(out,"\t\t\t\t</PositionKeyList>\n");
						}

						// write scaling keys
						if (nd->mNumScalingKeys) {
							fprintf(out,"\t\t\t\t<ScalingKeyList num=\"%u\">\n",nd->mNumScalingKeys);
							for (unsigned int a = 0; a < nd->mNumScalingKeys;++a) {
								aiVectorKey* vc = nd->mScalingKeys+a;
								fprintf(out,"\t\t\t\t\t<ScalingKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f\n\t\t\t\t\t</ScalingKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z);
							}
							fprintf(out,"\t\t\t\t</ScalingKeyList>\n");
						}

						// write rotation keys
						if (nd->mNumRotationKeys) {
							fprintf(out,"\t\t\t\t<RotationKeyList num=\"%u\">\n",nd->mNumRotationKeys);
							for (unsigned int a = 0; a < nd->mNumRotationKeys;++a) {
								aiQuatKey* vc = nd->mRotationKeys+a;
								fprintf(out,"\t\t\t\t\t<RotationKey time=\"%e\">\n"
									"\t\t\t\t\t\t%0 8f %0 8f %0 8f %0 8f\n\t\t\t\t\t</RotationKey>\n",
									vc->mTime,vc->mValue.x,vc->mValue.y,vc->mValue.z,vc->mValue.w);
							}
							fprintf(out,"\t\t\t\t</RotationKeyList>\n");
						}
					}
					fprintf(out,"\t\t\t</NodeAnim>\n");
				}
				fprintf(out,"\t\t</NodeAnimList>\n");
			}
			fprintf(out,"\t</Animation>\n");
		}
		fprintf(out,"</AnimationList>\n");
	}

	// write meshes
	if (scene->mNumMeshes) {
		fprintf(out,"<MeshList num=\"%u\">\n",scene->mNumMeshes);
		for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
			aiMesh* mesh = scene->mMeshes[i];
			// const unsigned int width = (unsigned int)log10((double)mesh->mNumVertices)+1;

			// mesh header
			fprintf(out,"\t<Mesh types=\"%s %s %s %s\" material_index=\"%u\">\n",
				(mesh->mPrimitiveTypes & aiPrimitiveType_POINT    ? "points"    : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_LINE     ? "lines"     : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_TRIANGLE ? "triangles" : ""),
				(mesh->mPrimitiveTypes & aiPrimitiveType_POLYGON  ? "polygons"  : ""),
				mesh->mMaterialIndex);

			// bones
			if (mesh->mNumBones) {
				fprintf(out,"\t\t<BoneList num=\"%u\">\n",mesh->mNumBones);

				for (unsigned int n = 0; n < mesh->mNumBones;++n) {
					aiBone* bone = mesh->mBones[n];

					ConvertName(name,bone->mName);
					// bone header
					fprintf(out,"\t\t\t<Bone name=\"%s\">\n"
						"\t\t\t\t<Matrix4> \n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t\t%0 6f %0 6f %0 6f %0 6f\n"
						"\t\t\t\t</Matrix4> \n",
						name.data,
						bone->mOffsetMatrix.a1,bone->mOffsetMatrix.a2,bone->mOffsetMatrix.a3,bone->mOffsetMatrix.a4,
						bone->mOffsetMatrix.b1,bone->mOffsetMatrix.b2,bone->mOffsetMatrix.b3,bone->mOffsetMatrix.b4,
						bone->mOffsetMatrix.c1,bone->mOffsetMatrix.c2,bone->mOffsetMatrix.c3,bone->mOffsetMatrix.c4,
						bone->mOffsetMatrix.d1,bone->mOffsetMatrix.d2,bone->mOffsetMatrix.d3,bone->mOffsetMatrix.d4);

					if (!shortened && bone->mNumWeights) {
						fprintf(out,"\t\t\t\t<WeightList num=\"%u\">\n",bone->mNumWeights);

						// bone weights
						for (unsigned int a = 0; a < bone->mNumWeights;++a) {
							aiVertexWeight* wght = bone->mWeights+a;

							fprintf(out,"\t\t\t\t\t<Weight index=\"%u\">\n\t\t\t\t\t\t%f\n\t\t\t\t\t</Weight>\n",
								wght->mVertexId,wght->mWeight);
						}
						fprintf(out,"\t\t\t\t</WeightList>\n");
					}
					fprintf(out,"\t\t\t</Bone>\n");
				}
				fprintf(out,"\t\t</BoneList>\n");
			}

			// faces
			if (!shortened && mesh->mNumFaces) {
				fprintf(out,"\t\t<FaceList num=\"%u\">\n",mesh->mNumFaces);
				for (unsigned int n = 0; n < mesh->mNumFaces; ++n) {
					aiFace& f = mesh->mFaces[n];
					fprintf(out,"\t\t\t<Face num=\"%u\">\n"
						"\t\t\t\t",f.mNumIndices);

					for (unsigned int j = 0; j < f.mNumIndices;++j)
						fprintf(out,"%u ",f.mIndices[j]);

					fprintf(out,"\n\t\t\t</Face>\n");
				}
				fprintf(out,"\t\t</FaceList>\n");
			}

			// vertex positions
			if (mesh->HasPositions()) {
				fprintf(out,"\t\t<Positions num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mVertices[n].x,
							mesh->mVertices[n].y,
							mesh->mVertices[n].z);
					}
				}
				fprintf(out,"\t\t</Positions>\n");
			}

			// vertex normals
			if (mesh->HasNormals()) {
				fprintf(out,"\t\t<Normals num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mNormals[n].x,
							mesh->mNormals[n].y,
							mesh->mNormals[n].z);
					}
				}
				else {
				}
				fprintf(out,"\t\t</Normals>\n");
			}

			// vertex tangents and bitangents
			if (mesh->HasTangentsAndBitangents()) {
				fprintf(out,"\t\t<Tangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mTangents[n].x,
							mesh->mTangents[n].y,
							mesh->mTangents[n].z);
					}
				}
				fprintf(out,"\t\t</Tangents>\n");

				fprintf(out,"\t\t<Bitangents num=\"%u\" set=\"0\" num_components=\"3\"> \n",mesh->mNumVertices);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
							mesh->mBitangents[n].x,
							mesh->mBitangents[n].y,
							mesh->mBitangents[n].z);
					}
				}
				fprintf(out,"\t\t</Bitangents>\n");
			}

			// texture coordinates
			for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
				if (!mesh->mTextureCoords[a])
					break;

				fprintf(out,"\t\t<TextureCoords num=\"%u\" set=\"%u\" num_components=\"%u\"> \n",mesh->mNumVertices,
					a,mesh->mNumUVComponents[a]);
				
				if (!shortened) {
					if (mesh->mNumUVComponents[a] == 3) {
						for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
							fprintf(out,"\t\t%0 8f %0 8f %0 8f\n",
								mesh->mTextureCoords[a][n].x,
								mesh->mTextureCoords[a][n].y,
								mesh->mTextureCoords[a][n].z);
						}
					}
					else {
						for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
							fprintf(out,"\t\t%0 8f %0 8f\n",
								mesh->mTextureCoords[a][n].x,
								mesh->mTextureCoords[a][n].y);
						}
					}
				}
				fprintf(out,"\t\t</TextureCoords>\n");
			}

			// vertex colors
			for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
				if (!mesh->mColors[a])
					break;
				fprintf(out,"\t\t<Colors num=\"%u\" set=\"%u\" num_components=\"4\"> \n",mesh->mNumVertices,a);
				if (!shortened) {
					for (unsigned int n = 0; n < mesh->mNumVertices; ++n) {
						fprintf(out,"\t\t%0 8f %0 8f %0 8f %0 8f\n",
							mesh->mColors[a][n].r,
							mesh->mColors[a][n].g,
							mesh->mColors[a][n].b,
							mesh->mColors[a][n].a);
					}
				}
				fprintf(out,"\t\t</Colors>\n");
			}
			fprintf(out,"\t</Mesh>\n");
		}
		fprintf(out,"</MeshList>\n");
	}
	fprintf(out,"</Scene>\n</ASSIMP>");
}